

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_same_tangent
          (REF_GRID_conflict ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  REF_INT cell;
  char *pcVar12;
  ulong uVar13;
  REF_DBL tangent1 [3];
  REF_DBL tangent0 [3];
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  *allowed = 1;
  uVar13 = 0xffffffff;
  cell = -1;
  if (-1 < remove) {
    pRVar2 = ref_cell->ref_adj;
    uVar13 = 0xffffffff;
    cell = -1;
    if (remove < pRVar2->nnode) {
      uVar5 = pRVar2->first[(uint)remove];
      uVar13 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar5 != -1) {
        cell = pRVar2->item[(int)uVar5].ref;
        uVar13 = (ulong)uVar5;
      }
    }
  }
  do {
    if ((int)uVar13 == -1) {
      return 0;
    }
    lVar9 = (long)cell * (long)ref_cell->size_per;
    if ((ref_cell->c2n[lVar9] != keep) && (ref_cell->c2n[lVar9 + 1] != keep)) {
      uVar5 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar5 != 0) {
        pcVar12 = "nodes";
        uVar11 = 0x454;
LAB_001e0cb9:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uVar11,"ref_collapse_edge_same_tangent",(ulong)uVar5,pcVar12);
        return uVar5;
      }
      uVar7 = (ulong)(uint)ref_cell->node_per;
      if (ref_cell->node_per < 1) {
        uVar7 = 0;
      }
      iVar8 = -1;
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        if (nodes[uVar10] != remove) {
          iVar8 = nodes[uVar10];
        }
      }
      if (iVar8 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x45b,"ref_collapse_edge_same_tangent","other not found");
        return 1;
      }
      pRVar3 = pRVar1->real;
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        tangent0[lVar9] = pRVar3[remove * 0xf + lVar9] - pRVar3[iVar8 * 0xf + lVar9];
        tangent1[lVar9] = pRVar3[keep * 0xf + lVar9] - pRVar3[iVar8 * 0xf + lVar9];
      }
      uVar5 = ref_math_normalize(tangent0);
      if (uVar5 != 0) {
        pcVar12 = "zero length orig quad";
        uVar11 = 0x462;
        goto LAB_001e0cb9;
      }
      RVar6 = ref_math_normalize(tangent1);
      if ((RVar6 == 4) ||
         (tangent0[2] * tangent1[2] + tangent0[0] * tangent1[0] + tangent0[1] * tangent1[1] <
          pRVar1->same_normal_tol)) {
        *allowed = 0;
        return 0;
      }
    }
    pRVar4 = ref_cell->ref_adj->item;
    uVar13 = (ulong)pRVar4[(int)uVar13].next;
    cell = -1;
    if (uVar13 != 0xffffffffffffffff) {
      cell = pRVar4[uVar13].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_tangent(REF_GRID ref_grid,
                                                  REF_INT keep, REF_INT remove,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell;
  REF_INT other, node, ixyz;
  REF_DBL tangent0[3], tangent1[3];
  REF_DBL dot;
  REF_STATUS status;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    /* a quad with keep and remove will be removed */
    if (keep == ref_cell_c2n(ref_cell, 0, cell) ||
        keep == ref_cell_c2n(ref_cell, 1, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    other = REF_EMPTY;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (nodes[node] != remove) {
        other = nodes[node];
      }
    }
    RAS(REF_EMPTY != other, "other not found");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      tangent0[ixyz] = ref_node_xyz(ref_node, ixyz, remove) -
                       ref_node_xyz(ref_node, ixyz, other);
      tangent1[ixyz] = ref_node_xyz(ref_node, ixyz, keep) -
                       ref_node_xyz(ref_node, ixyz, other);
    }
    RSS(ref_math_normalize(tangent0), "zero length orig quad");
    status = ref_math_normalize(tangent1);
    if (REF_DIV_ZERO == status) { /* new quad face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    dot = ref_math_dot(tangent0, tangent1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}